

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::AppendUserMessage
                   (string *__return_storage_ptr__,string *gtest_msg,Message *user_msg)

{
  string *psVar1;
  undefined1 local_60 [8];
  string user_msg_string;
  
  Message::GetString_abi_cxx11_((string *)local_60,user_msg);
  psVar1 = gtest_msg;
  if ((user_msg_string._M_dataplus._M_p == (pointer)0x0) ||
     (psVar1 = (string *)local_60, gtest_msg->_M_string_length == 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&user_msg_string.field_2 + 8),gtest_msg,"\n");
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&user_msg_string.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::~string((string *)(user_msg_string.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }
  if (gtest_msg.empty()) {
    return user_msg_string;
  }
  return gtest_msg + "\n" + user_msg_string;
}